

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# all.hpp
# Opt level: O2

void __thiscall
timertt::details::
basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
::
basic_methods_impl_mixin<unsigned_long&,std::function<void(std::__cxx11::string_const&)>&,std::function<void(std::exception_const&)>&>
          (basic_methods_impl_mixin<timertt::details::timer_heap_engine<timertt::thread_safety::safe,std::function<void(std::__cxx11::string_const&)>,std::function<void(std::exception_const&)>>,timertt::details::consumer_type::thread>
           *this,unsigned_long *args,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *args_1,function<void_(const_std::exception_&)> *args_2)

{
  size_t initial_heap_capacity;
  function<void_(const_std::exception_&)> local_60;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_40;
  
  thread_mixin::thread_mixin((thread_mixin *)this);
  initial_heap_capacity = *args;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_40,args_1);
  std::function<void_(const_std::exception_&)>::function(&local_60,args_2);
  timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
  ::timer_heap_engine((timer_heap_engine<timertt::thread_safety::safe,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::exception_&)>_>
                       *)(this + 0x68),initial_heap_capacity,&local_40,&local_60);
  std::_Function_base::~_Function_base(&local_60.super__Function_base);
  std::_Function_base::~_Function_base(&local_40.super__Function_base);
  return;
}

Assistant:

basic_methods_impl_mixin(
		ARGS && ... args )
		:	m_engine( std::forward< ARGS >(args)... )
	{
	}